

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSkinnedMesh.cpp
# Opt level: O3

void __thiscall
irr::scene::CSkinnedMesh::getFrameData
          (CSkinnedMesh *this,f32 frame,SJoint *joint,vector3df *position,s32 *positionHint,
          vector3df *scale,s32 *scaleHint,quaternion *rotation,s32 *rotationHint)

{
  quaternion *pqVar1;
  f32 *pfVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  float fVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  float fVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  SJoint *pSVar17;
  pointer pSVar18;
  pointer pSVar19;
  pointer pSVar20;
  undefined1 auVar21 [16];
  f32 fVar22;
  f32 fVar23;
  f32 fVar24;
  uint uVar25;
  ulong uVar26;
  pointer pSVar27;
  pointer pSVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  pointer pSVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar40;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar41;
  
  pSVar17 = joint->UseAnimationFrom;
  if (pSVar17 == (SJoint *)0x0) {
    return;
  }
  pSVar18 = (pSVar17->PositionKeys).m_data.
            super__Vector_base<irr::scene::ISkinnedMesh::SPositionKey,_std::allocator<irr::scene::ISkinnedMesh::SPositionKey>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar31 = (ulong)((long)(pSVar17->PositionKeys).m_data.
                         super__Vector_base<irr::scene::ISkinnedMesh::SPositionKey,_std::allocator<irr::scene::ISkinnedMesh::SPositionKey>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar18) >> 4;
  uVar25 = (uint)uVar31;
  if (uVar25 != 0) {
    uVar29 = *positionHint;
    uVar26 = (ulong)uVar29;
    if (((int)uVar29 < 0) || (uVar25 <= uVar29)) {
LAB_001a0492:
      uVar30 = 0;
      pSVar32 = pSVar18;
      do {
        if ((float)frame <= (float)pSVar32->frame) goto LAB_001a0459;
        uVar30 = uVar30 + 1;
        pSVar32 = pSVar32 + 1;
      } while ((uVar31 & 0xffffffff) != uVar30);
    }
    else {
      if ((uVar29 == 0) ||
         (((float)pSVar18[uVar26].frame < (float)frame ||
          ((float)frame < (float)pSVar18[uVar26 - 1].frame ||
           (float)frame == (float)pSVar18[uVar26 - 1].frame)))) {
        uVar30 = uVar26 + 1;
        if (((int)uVar25 <= (int)uVar30) ||
           (((float)pSVar18[uVar30].frame < (float)frame ||
            ((float)frame < (float)pSVar18[uVar26].frame ||
             (float)frame == (float)pSVar18[uVar26].frame)))) goto LAB_001a0492;
LAB_001a0459:
        *positionHint = (s32)uVar30;
        uVar26 = uVar30 & 0xffffffff;
      }
      if ((int)uVar26 == 0 || this->field_0xb5 == '\0') {
        position->Z = pSVar18[uVar26].position.Z;
        fVar7 = pSVar18[uVar26].position.Y;
        position->X = pSVar18[uVar26].position.X;
        position->Y = fVar7;
      }
      else if (this->field_0xb5 == '\x01') {
        uVar25 = (int)uVar26 - 1;
        fVar36 = (float)frame - (float)pSVar18[uVar26].frame;
        fVar7 = pSVar18[uVar25].position.Z;
        fVar14 = pSVar18[uVar26].position.Z;
        fVar40 = ((float)pSVar18[uVar25].frame - (float)frame) + fVar36;
        uVar3 = pSVar18[uVar25].position.X;
        uVar10 = pSVar18[uVar25].position.Y;
        uVar4 = pSVar18[uVar26].position.X;
        uVar11 = pSVar18[uVar26].position.Y;
        auVar37._0_4_ = (float)uVar3 - (float)uVar4;
        auVar37._4_4_ = (float)uVar10 - (float)uVar11;
        auVar37._8_8_ = 0;
        auVar39._4_4_ = fVar40;
        auVar39._0_4_ = fVar40;
        auVar39._8_8_ = 0;
        auVar39 = divps(auVar37,auVar39);
        position->X = fVar36 * auVar39._0_4_ + (float)uVar4;
        position->Y = fVar36 * auVar39._4_4_ + (float)uVar11;
        position->Z = ((fVar7 - fVar14) / fVar40) * fVar36 + fVar14;
      }
    }
  }
  pSVar19 = (pSVar17->ScaleKeys).m_data.
            super__Vector_base<irr::scene::ISkinnedMesh::SScaleKey,_std::allocator<irr::scene::ISkinnedMesh::SScaleKey>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar31 = (ulong)((long)(pSVar17->ScaleKeys).m_data.
                         super__Vector_base<irr::scene::ISkinnedMesh::SScaleKey,_std::allocator<irr::scene::ISkinnedMesh::SScaleKey>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar19) >> 4;
  uVar25 = (uint)uVar31;
  if (uVar25 != 0) {
    uVar29 = *scaleHint;
    uVar26 = (ulong)uVar29;
    if (((int)uVar29 < 0) || (uVar25 <= uVar29)) {
LAB_001a05ca:
      uVar30 = 0;
      pSVar27 = pSVar19;
      do {
        if ((float)frame <= (float)pSVar27->frame) goto LAB_001a0590;
        uVar30 = uVar30 + 1;
        pSVar27 = pSVar27 + 1;
      } while ((uVar31 & 0xffffffff) != uVar30);
    }
    else {
      if ((uVar29 == 0) ||
         (((float)pSVar19[uVar26].frame < (float)frame ||
          ((float)frame < (float)pSVar19[uVar26 - 1].frame ||
           (float)frame == (float)pSVar19[uVar26 - 1].frame)))) {
        uVar30 = uVar26 + 1;
        if (((int)uVar25 <= (int)uVar30) ||
           (((float)pSVar19[uVar30].frame < (float)frame ||
            ((float)frame < (float)pSVar19[uVar26].frame ||
             (float)frame == (float)pSVar19[uVar26].frame)))) goto LAB_001a05ca;
LAB_001a0590:
        uVar29 = (uint)uVar30;
        *scaleHint = uVar29;
      }
      if (uVar29 == 0 || this->field_0xb5 == '\0') {
        scale->Z = pSVar19[uVar29].scale.Z;
        fVar7 = pSVar19[uVar29].scale.Y;
        scale->X = pSVar19[uVar29].scale.X;
        scale->Y = fVar7;
      }
      else if (this->field_0xb5 == '\x01') {
        uVar25 = uVar29 - 1;
        fVar36 = (float)frame - (float)pSVar19[uVar29].frame;
        fVar7 = pSVar19[uVar25].scale.Z;
        fVar14 = pSVar19[uVar29].scale.Z;
        fVar40 = ((float)pSVar19[uVar25].frame - (float)frame) + fVar36;
        uVar5 = pSVar19[uVar25].scale.X;
        uVar12 = pSVar19[uVar25].scale.Y;
        uVar6 = pSVar19[uVar29].scale.X;
        uVar13 = pSVar19[uVar29].scale.Y;
        auVar38._0_4_ = (float)uVar5 - (float)uVar6;
        auVar38._4_4_ = (float)uVar12 - (float)uVar13;
        auVar38._8_8_ = 0;
        auVar21._4_4_ = fVar40;
        auVar21._0_4_ = fVar40;
        auVar21._8_8_ = 0;
        auVar39 = divps(auVar38,auVar21);
        scale->X = fVar36 * auVar39._0_4_ + (float)uVar6;
        scale->Y = fVar36 * auVar39._4_4_ + (float)uVar13;
        scale->Z = ((fVar7 - fVar14) / fVar40) * fVar36 + fVar14;
      }
    }
  }
  pSVar20 = (pSVar17->RotationKeys).m_data.
            super__Vector_base<irr::scene::ISkinnedMesh::SRotationKey,_std::allocator<irr::scene::ISkinnedMesh::SRotationKey>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar31 = ((long)(pSVar17->RotationKeys).m_data.
                  super__Vector_base<irr::scene::ISkinnedMesh::SRotationKey,_std::allocator<irr::scene::ISkinnedMesh::SRotationKey>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar20 >> 2) *
           -0x3333333333333333;
  uVar25 = (uint)uVar31;
  if (uVar25 == 0) {
    return;
  }
  uVar29 = *rotationHint;
  uVar26 = (ulong)uVar29;
  if (((int)uVar29 < 0) || (uVar25 <= uVar29)) {
LAB_001a0709:
    uVar30 = 0;
    pSVar28 = pSVar20;
    do {
      if ((float)frame <= (float)pSVar28->frame) goto LAB_001a06d1;
      uVar30 = uVar30 + 1;
      pSVar28 = pSVar28 + 1;
    } while ((uVar31 & 0xffffffff) != uVar30);
  }
  else {
    if ((uVar29 == 0) ||
       (((float)pSVar20[uVar26].frame < (float)frame ||
        ((float)frame < (float)pSVar20[uVar26 - 1].frame ||
         (float)frame == (float)pSVar20[uVar26 - 1].frame)))) {
      uVar30 = uVar26 + 1;
      if (((int)uVar25 <= (int)uVar30) ||
         (((float)pSVar20[uVar30].frame < (float)frame ||
          ((float)frame < (float)pSVar20[uVar26].frame ||
           (float)frame == (float)pSVar20[uVar26].frame)))) goto LAB_001a0709;
LAB_001a06d1:
      uVar29 = (uint)uVar30;
      *rotationHint = uVar29;
    }
    if (uVar29 == 0 || this->field_0xb5 == '\0') {
      pqVar1 = &pSVar20[uVar29].rotation;
      fVar22 = pqVar1->Y;
      fVar23 = pqVar1->Z;
      fVar24 = pqVar1->W;
      rotation->X = pqVar1->X;
      rotation->Y = fVar22;
      rotation->Z = fVar23;
      rotation->W = fVar24;
    }
    else if (this->field_0xb5 == '\x01') {
      uVar25 = uVar29 - 1;
      fVar41 = (float)frame - (float)pSVar20[uVar29].frame;
      fVar7 = (float)pSVar20[uVar29].rotation.X;
      fVar14 = (float)pSVar20[uVar29].rotation.Y;
      pfVar2 = &pSVar20[uVar29].rotation.Z;
      fVar36 = (float)*pfVar2;
      fVar40 = (float)pfVar2[1];
      uVar8 = pSVar20[uVar25].rotation.X;
      uVar15 = pSVar20[uVar25].rotation.Y;
      uVar9 = pSVar20[uVar25].rotation.Z;
      uVar16 = pSVar20[uVar25].rotation.W;
      fVar35 = fVar40 * (float)uVar16 +
               fVar36 * (float)uVar9 + fVar7 * (float)uVar8 + fVar14 * (float)uVar15;
      fVar33 = -fVar35;
      if (fVar35 < fVar33) {
        fVar7 = -fVar7;
        fVar14 = -fVar14;
        fVar36 = -fVar36;
        fVar40 = -fVar40;
      }
      fVar41 = fVar41 / (((float)pSVar20[uVar25].frame - (float)frame) + fVar41);
      if (fVar33 <= fVar35) {
        fVar33 = fVar35;
      }
      if (fVar33 <= 0.95) {
        fVar33 = acosf(fVar33);
        fVar35 = sinf(fVar33);
        fVar34 = sinf((1.0 - fVar41) * fVar33);
        fVar34 = fVar34 * (1.0 / fVar35);
        fVar41 = sinf(fVar41 * fVar33);
        fVar41 = fVar41 * (1.0 / fVar35);
        fVar33 = (float)uVar8 * fVar41 + fVar7 * fVar34;
        fVar14 = (float)uVar15 * fVar41 + fVar14 * fVar34;
        fVar36 = (float)uVar9 * fVar41 + fVar36 * fVar34;
        fVar7 = (float)uVar16 * fVar41 + fVar40 * fVar34;
      }
      else {
        fVar35 = 1.0 - fVar41;
        fVar36 = fVar36 * fVar35 + fVar41 * (float)uVar9;
        fVar40 = fVar40 * fVar35 + fVar41 * (float)uVar16;
        fVar33 = fVar35 * fVar7 + (float)uVar8 * fVar41;
        fVar14 = fVar35 * fVar14 + (float)uVar15 * fVar41;
        fVar7 = 1.0 / SQRT(fVar40 * fVar40 + fVar36 * fVar36 + fVar33 * fVar33 + fVar14 * fVar14);
        fVar33 = fVar33 * fVar7;
        fVar14 = fVar14 * fVar7;
        fVar36 = fVar7 * fVar36;
        fVar7 = fVar7 * fVar40;
      }
      rotation->X = (f32)fVar33;
      rotation->Y = (f32)fVar14;
      rotation->Z = (f32)fVar36;
      rotation->W = (f32)fVar7;
    }
  }
  return;
}

Assistant:

void CSkinnedMesh::getFrameData(f32 frame, SJoint *joint,
		core::vector3df &position, s32 &positionHint,
		core::vector3df &scale, s32 &scaleHint,
		core::quaternion &rotation, s32 &rotationHint)
{
	s32 foundPositionIndex = -1;
	s32 foundScaleIndex = -1;
	s32 foundRotationIndex = -1;

	if (joint->UseAnimationFrom) {
		const core::array<SPositionKey> &PositionKeys = joint->UseAnimationFrom->PositionKeys;
		const core::array<SScaleKey> &ScaleKeys = joint->UseAnimationFrom->ScaleKeys;
		const core::array<SRotationKey> &RotationKeys = joint->UseAnimationFrom->RotationKeys;

		if (PositionKeys.size()) {
			foundPositionIndex = -1;

			// Test the Hints...
			if (positionHint >= 0 && (u32)positionHint < PositionKeys.size()) {
				// check this hint
				if (positionHint > 0 && PositionKeys[positionHint].frame >= frame && PositionKeys[positionHint - 1].frame < frame)
					foundPositionIndex = positionHint;
				else if (positionHint + 1 < (s32)PositionKeys.size()) {
					// check the next index
					if (PositionKeys[positionHint + 1].frame >= frame &&
							PositionKeys[positionHint + 0].frame < frame) {
						positionHint++;
						foundPositionIndex = positionHint;
					}
				}
			}

			// The hint test failed, do a full scan...
			if (foundPositionIndex == -1) {
				for (u32 i = 0; i < PositionKeys.size(); ++i) {
					if (PositionKeys[i].frame >= frame) { // Keys should to be sorted by frame
						foundPositionIndex = i;
						positionHint = i;
						break;
					}
				}
			}

			// Do interpolation...
			if (foundPositionIndex != -1) {
				if (InterpolationMode == EIM_CONSTANT || foundPositionIndex == 0) {
					position = PositionKeys[foundPositionIndex].position;
				} else if (InterpolationMode == EIM_LINEAR) {
					const SPositionKey &KeyA = PositionKeys[foundPositionIndex];
					const SPositionKey &KeyB = PositionKeys[foundPositionIndex - 1];

					const f32 fd1 = frame - KeyA.frame;
					const f32 fd2 = KeyB.frame - frame;
					position = ((KeyB.position - KeyA.position) / (fd1 + fd2)) * fd1 + KeyA.position;
				}
			}
		}

		//------------------------------------------------------------

		if (ScaleKeys.size()) {
			foundScaleIndex = -1;

			// Test the Hints...
			if (scaleHint >= 0 && (u32)scaleHint < ScaleKeys.size()) {
				// check this hint
				if (scaleHint > 0 && ScaleKeys[scaleHint].frame >= frame && ScaleKeys[scaleHint - 1].frame < frame)
					foundScaleIndex = scaleHint;
				else if (scaleHint + 1 < (s32)ScaleKeys.size()) {
					// check the next index
					if (ScaleKeys[scaleHint + 1].frame >= frame &&
							ScaleKeys[scaleHint + 0].frame < frame) {
						scaleHint++;
						foundScaleIndex = scaleHint;
					}
				}
			}

			// The hint test failed, do a full scan...
			if (foundScaleIndex == -1) {
				for (u32 i = 0; i < ScaleKeys.size(); ++i) {
					if (ScaleKeys[i].frame >= frame) { // Keys should to be sorted by frame
						foundScaleIndex = i;
						scaleHint = i;
						break;
					}
				}
			}

			// Do interpolation...
			if (foundScaleIndex != -1) {
				if (InterpolationMode == EIM_CONSTANT || foundScaleIndex == 0) {
					scale = ScaleKeys[foundScaleIndex].scale;
				} else if (InterpolationMode == EIM_LINEAR) {
					const SScaleKey &KeyA = ScaleKeys[foundScaleIndex];
					const SScaleKey &KeyB = ScaleKeys[foundScaleIndex - 1];

					const f32 fd1 = frame - KeyA.frame;
					const f32 fd2 = KeyB.frame - frame;
					scale = ((KeyB.scale - KeyA.scale) / (fd1 + fd2)) * fd1 + KeyA.scale;
				}
			}
		}

		//-------------------------------------------------------------

		if (RotationKeys.size()) {
			foundRotationIndex = -1;

			// Test the Hints...
			if (rotationHint >= 0 && (u32)rotationHint < RotationKeys.size()) {
				// check this hint
				if (rotationHint > 0 && RotationKeys[rotationHint].frame >= frame && RotationKeys[rotationHint - 1].frame < frame)
					foundRotationIndex = rotationHint;
				else if (rotationHint + 1 < (s32)RotationKeys.size()) {
					// check the next index
					if (RotationKeys[rotationHint + 1].frame >= frame &&
							RotationKeys[rotationHint + 0].frame < frame) {
						rotationHint++;
						foundRotationIndex = rotationHint;
					}
				}
			}

			// The hint test failed, do a full scan...
			if (foundRotationIndex == -1) {
				for (u32 i = 0; i < RotationKeys.size(); ++i) {
					if (RotationKeys[i].frame >= frame) { // Keys should be sorted by frame
						foundRotationIndex = i;
						rotationHint = i;
						break;
					}
				}
			}

			// Do interpolation...
			if (foundRotationIndex != -1) {
				if (InterpolationMode == EIM_CONSTANT || foundRotationIndex == 0) {
					rotation = RotationKeys[foundRotationIndex].rotation;
				} else if (InterpolationMode == EIM_LINEAR) {
					const SRotationKey &KeyA = RotationKeys[foundRotationIndex];
					const SRotationKey &KeyB = RotationKeys[foundRotationIndex - 1];

					const f32 fd1 = frame - KeyA.frame;
					const f32 fd2 = KeyB.frame - frame;
					const f32 t = fd1 / (fd1 + fd2);

					/*
					f32 t = 0;
					if (KeyA.frame!=KeyB.frame)
						t = (frame-KeyA.frame) / (KeyB.frame - KeyA.frame);
					*/

					rotation.slerp(KeyA.rotation, KeyB.rotation, t);
				}
			}
		}
	}
}